

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O2

bool __thiscall apngasm::APNGAsm::savePNGs(APNGAsm *this,string *outputDir)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  string outputPath;
  string local_50;
  
  uVar4 = ((long)(this->_frames).
                 super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl
                 .super__Vector_impl_data._M_finish -
          (long)(this->_frames).
                super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x430;
  uVar5 = 0;
  iVar3 = (int)uVar4;
  uVar4 = uVar4 & 0xffffffff;
  if (iVar3 < 1) {
    uVar4 = uVar5;
  }
  uVar6 = 0;
  do {
    if (uVar4 == uVar6) {
LAB_00154f3a:
      return (long)iVar3 <= (long)uVar6;
    }
    (**(code **)(*(long *)this->_listener + 0x40))
              (&local_50,this->_listener,outputDir,uVar6 & 0xffffffff);
    cVar1 = (**(code **)(*(long *)this->_listener + 0x30))(this->_listener,&local_50);
    if (cVar1 == '\0') {
LAB_00154f30:
      std::__cxx11::string::~string((string *)&local_50);
      goto LAB_00154f3a;
    }
    bVar2 = APNGFrame::save((APNGFrame *)
                            ((long)((this->_frames).
                                    super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_palette +
                            uVar5 + -0x11),&local_50);
    if (!bVar2) goto LAB_00154f30;
    (**(code **)(*(long *)this->_listener + 0x38))(this->_listener,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    uVar6 = uVar6 + 1;
    uVar5 = uVar5 + 0x430;
  } while( true );
}

Assistant:

bool APNGAsm::savePNGs(const std::string& outputDir) const
  {
    const int count = _frames.size();
    for(int i = 0;  i < count;  ++i)
    {
      const std::string outputPath = _listener->onCreatePngPath(outputDir, i);

      if( !_listener->onPreSave(outputPath) )
        return false;

      if( !_frames[i].save(outputPath) )
        return false;

      _listener->onPostSave(outputPath);
    }
    return true;
  }